

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O1

void __thiscall
miniros::PeerConnDisconnCallback::PeerConnDisconnCallback
          (PeerConnDisconnCallback *this,SubscriberStatusCallback *callback,
          SubscriberLinkPtr *sub_link,bool use_tracked_object,VoidConstWPtr *tracked_object)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_CallbackInterface)._vptr_CallbackInterface =
       (_func_int **)&PTR__PeerConnDisconnCallback_002abfb8;
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::function
            (&this->callback_,callback);
  (this->sub_link_).super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (sub_link->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (sub_link->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->sub_link_).super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->use_tracked_object_ = use_tracked_object;
  (this->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (tracked_object->super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (tracked_object->super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
    }
  }
  return;
}

Assistant:

PeerConnDisconnCallback(const SubscriberStatusCallback& callback, const SubscriberLinkPtr& sub_link, bool use_tracked_object, const VoidConstWPtr& tracked_object)
  : callback_(callback)
  , sub_link_(sub_link)
  , use_tracked_object_(use_tracked_object)
  , tracked_object_(tracked_object)
  {
  }